

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O0

void __thiscall
ncnn::ObjectsManager::do_object_boxs_table_nms
          (ObjectsManager *this,ObjectBoxNmsCondition *condition,int start_index,int end_index)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  *in_RDI;
  SafeOrderList<ncnn::ObjectBox> *in_stack_00000010;
  ObjectBoxNmsCondition in_stack_00000018;
  TObjectBoxs *object_boxs;
  int i;
  SafeOrderList<ncnn::ObjectBox> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  for (local_1c = in_EDX; local_1c < in_ECX; local_1c = local_1c + 1) {
    std::
    vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
    ::operator[](in_RDI,(long)local_1c);
    bVar1 = SafeOrderList<ncnn::ObjectBox>::empty(in_stack_ffffffffffffffd0);
    if (!bVar1) {
      in_stack_ffffffffffffffd0 = *(SafeOrderList<ncnn::ObjectBox> **)(in_RSI + 8);
      SafeOrderList<ncnn::ObjectBox>::remove_all_match<ncnn::ObjectBoxNmsCondition>
                (in_stack_00000010,in_stack_00000018);
    }
  }
  return;
}

Assistant:

inline void ObjectsManager::do_object_boxs_table_nms(ObjectBoxNmsCondition &condition, int start_index,  int end_index)
{
    for (int i = start_index; i < end_index; i++)
    {
        TObjectBoxs &object_boxs = *object_boxs_table[i];
        if (object_boxs.empty())
        {
            continue;
        }

        object_boxs.remove_all_match(condition);
    }
}